

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotHeatmap<double>
               (char *label_id,double *values,int rows,int cols,double scale_min,double scale_max,
               char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  TransformerLinLin transformer;
  bool bVar1;
  ImDrawList *DrawList;
  
  bVar1 = BeginItem(label_id,-1);
  if (!bVar1) {
    return;
  }
  if (GImPlot->FitThisFrame == true) {
    FitPoint(bounds_min);
    FitPoint(bounds_max);
  }
  DrawList = GetPlotDrawList();
  transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
  switch(GImPlot->Scales[transformer.YAxis]) {
  case 0:
    RenderHeatmap<double,ImPlot::TransformerLinLin>
              (transformer,DrawList,values,rows,cols,scale_min,scale_max,fmt,bounds_min,bounds_max,
               true);
    break;
  case 1:
    RenderHeatmap<double,ImPlot::TransformerLogLin>
              ((TransformerLogLin)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 2:
    RenderHeatmap<double,ImPlot::TransformerLinLog>
              ((TransformerLinLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 3:
    RenderHeatmap<double,ImPlot::TransformerLogLog>
              ((TransformerLogLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
  }
  EndItem();
  return;
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
        }
        EndItem();
    }
}